

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

size_t ctemplate::Template::InsertLine
                 (char *line,size_t len,Strip strip,MarkerDelimiters *delim,char *buffer)

{
  bool bVar1;
  bool bVar2;
  bool add_newline;
  char *buffer_local;
  MarkerDelimiters *delim_local;
  size_t sStack_18;
  Strip strip_local;
  size_t len_local;
  char *line_local;
  
  bVar2 = false;
  if (len != 0) {
    bVar2 = line[len - 1] == '\n';
  }
  sStack_18 = len;
  if (bVar2) {
    sStack_18 = len - 1;
  }
  len_local = (size_t)line;
  if ((int)strip < 2) {
    if ((0 < (int)strip) &&
       (bVar1 = IsBlankOrOnlyHasOneRemovableMarker
                          ((char **)&len_local,&stack0xffffffffffffffe8,delim), bVar1)) {
      bVar2 = false;
    }
  }
  else {
    StripTemplateWhiteSpace((char **)&len_local,&stack0xffffffffffffffe8);
    bVar2 = false;
  }
  memcpy(buffer,(void *)len_local,sStack_18);
  if (bVar2) {
    buffer[sStack_18] = '\n';
    sStack_18 = sStack_18 + 1;
  }
  return sStack_18;
}

Assistant:

size_t Template::InsertLine(const char *line, size_t len, Strip strip,
                            const MarkerDelimiters& delim, char* buffer) {
  bool add_newline = (len > 0 && line[len-1] == '\n');
  if (add_newline)
    len--;                 // so we ignore the newline from now on

  if (strip >= STRIP_WHITESPACE) {
    StripTemplateWhiteSpace(&line, &len);
    add_newline = false;

    // IsBlankOrOnlyHasOneRemovableMarker may modify the two input
    // parameters if the line contains only spaces or only one input
    // marker.  This modification must be done before the line is
    // written to the input buffer. Hence the need for the boolean flag
    // add_newline to be referenced after the Write statement.
  } else if (strip >= STRIP_BLANK_LINES
             && IsBlankOrOnlyHasOneRemovableMarker(&line, &len, delim)) {
    add_newline = false;
  }

  memcpy(buffer, line, len);

  if (add_newline) {
    buffer[len++] = '\n';
  }
  return len;
}